

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAsyncWorker.hpp
# Opt level: O2

void __thiscall sftm::CAsyncWorker::ThreadFunc(CAsyncWorker *this)

{
  CAsyncTask *pCVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  while (this->m_bStopping == false) {
    pCVar1 = CConcurrentPtrQueue<sftm::CAsyncTask>::Pop((this->m_ownerData).m_pTaskQueue);
    if (pCVar1 != (CAsyncTask *)0x0) {
      (*pCVar1->_vptr_CAsyncTask[2])(pCVar1);
    }
    std::unique_lock<std::mutex>::unique_lock(&local_20,(this->m_ownerData).m_pMutWorkerIdle);
    std::condition_variable::wait((unique_lock *)(this->m_ownerData).m_pCvWorkerIdle);
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
  }
  this->m_bFinished = true;
  return;
}

Assistant:

void ThreadFunc() noexcept
		{
			while (!m_bStopping)
			{
				CAsyncTask* pTask = m_ownerData.m_pTaskQueue->Pop();
				if (pTask)
					pTask->Execute();

				std::unique_lock<std::mutex> lock(*m_ownerData.m_pMutWorkerIdle);
				m_ownerData.m_pCvWorkerIdle->wait(lock);
			}

			m_bFinished = true;
		}